

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenSwitchInsertNameAt(BinaryenExpressionRef expr,BinaryenIndex index,char *name)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id != SwitchId) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x898,
                  "void BinaryenSwitchInsertNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  if (name != (char *)0x0) {
    this = (IString *)strlen(name);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)name;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::insertAt
              ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(expr + 1),(ulong)index,
               (Name)sVar1);
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x899,
                "void BinaryenSwitchInsertNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
               );
}

Assistant:

void BinaryenSwitchInsertNameAt(BinaryenExpressionRef expr,
                                BinaryenIndex index,
                                const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  assert(name);
  static_cast<Switch*>(expression)->targets.insertAt(index, name);
}